

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

char * __thiscall Analyzer::getFunctionName(Analyzer *this,Node *node)

{
  bool bVar1;
  uint uVar2;
  Node *pNVar4;
  pointer ppNVar3;
  
  if (node->nodeType - PNT_FUNCTION_CALL < 2) {
    ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pNVar4 = *ppNVar3;
    bVar1 = true;
    if (pNVar4 != (Node *)0x0) {
      uVar2 = pNVar4->nodeType - PNT_ACCESS_MEMBER;
      ppNVar3 = (pointer)(ulong)uVar2;
      if (uVar2 < 2) {
        ppNVar3 = (pNVar4->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pNVar4 = ppNVar3[1];
      }
      if (pNVar4->nodeType == PNT_IDENTIFIER) {
        ppNVar3 = (pointer)(pNVar4->tok->u).d;
        bVar1 = false;
      }
    }
    if (!bVar1) {
      return (char *)ppNVar3;
    }
  }
  return "";
}

Assistant:

const char * getFunctionName(Node * node)
  {
    if (node->nodeType == PNT_FUNCTION_CALL || node->nodeType == PNT_FUNCTION_CALL_IF_NOT_NULL)
    {
      Node * functionNameNode = node->children[0];

      if (functionNameNode)
      {
        if (functionNameNode->nodeType == PNT_ACCESS_MEMBER || functionNameNode->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL)
          functionNameNode = functionNameNode->children[1];

        if (functionNameNode->nodeType == PNT_IDENTIFIER)
        {
          const char * functionName = functionNameNode->tok.u.s;
          return functionName;
        }
      }
    }

    return "";
  }